

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O1

void __thiscall
duckdb::ClientContext::BeginQueryInternal(ClientContext *this,ClientContextLock *lock,string *query)

{
  shared_ptr<duckdb::DatabaseInstance,_true> *this_00;
  atomic<unsigned_long> *paVar1;
  TransactionContext *this_01;
  _Head_base<0UL,_duckdb::ActiveQueryContext_*,_false> __ptr;
  _Head_base<0UL,_duckdb::Logger_*,_false> _Var2;
  LoggingContext context;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  pointer __p;
  type pDVar7;
  _Head_base<0UL,_duckdb::ActiveQueryContext_*,_false> _Var8;
  DatabaseInstance *pDVar9;
  DatabaseManager *pDVar10;
  pointer pAVar11;
  pointer this_02;
  ClientContextState *pCVar12;
  pointer pLVar13;
  MetaTransaction *pMVar14;
  idx_t index;
  type pLVar15;
  Logger *this_03;
  FatalException *__return_storage_ptr__;
  ClientContextLock *query_number;
  shared_ptr<duckdb::ClientContextState,_true> *state;
  ActiveQueryContext *this_04;
  undefined1 local_78 [64];
  _Alloc_hider local_38;
  
  this_00 = &this->db;
  pDVar7 = shared_ptr<duckdb::DatabaseInstance,_true>::operator*(this_00);
  if (((pDVar7->db_validity).is_invalidated._M_base._M_i & 1U) == 0) {
    _Var8._M_head_impl = (ActiveQueryContext *)operator_new(0x48);
    ((_Var8._M_head_impl)->query)._M_dataplus = 0;
    ((_Var8._M_head_impl)->query)._M_string_length = 0;
    ((_Var8._M_head_impl)->query).field_2._M_allocated_capacity = 0;
    *(undefined8 *)((long)((_Var8._M_head_impl)->query).field_2._M_local_buf + 8) = 0;
    *(undefined8 *)&((_Var8._M_head_impl)->prepared).internal = 0;
    ((_Var8._M_head_impl)->prepared).internal.
    super___shared_ptr<duckdb::PreparedStatementData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ((_Var8._M_head_impl)->executor).
    super_unique_ptr<duckdb::Executor,_std::default_delete<duckdb::Executor>_> =
         (unique_ptr<duckdb::Executor,_std::default_delete<duckdb::Executor>_>)0x0;
    ((_Var8._M_head_impl)->progress_bar).
    super_unique_ptr<duckdb::ProgressBar,_std::default_delete<duckdb::ProgressBar>_> =
         (unique_ptr<duckdb::ProgressBar,_std::default_delete<duckdb::ProgressBar>_>)0x0;
    (_Var8._M_head_impl)->open_result = (BaseQueryResult *)0x0;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&(_Var8._M_head_impl)->query = &((_Var8._M_head_impl)->query).field_2;
    ((_Var8._M_head_impl)->query)._M_string_length = 0;
    ((_Var8._M_head_impl)->query).field_2._M_local_buf[0] = '\0';
    local_78._0_8_ = (ActiveQueryContext *)0x0;
    __ptr._M_head_impl =
         (this->active_query).
         super_unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>_>
         ._M_t.
         super___uniq_ptr_impl<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ActiveQueryContext_*,_std::default_delete<duckdb::ActiveQueryContext>_>
         .super__Head_base<0UL,_duckdb::ActiveQueryContext_*,_false>._M_head_impl;
    (this->active_query).
    super_unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>_>.
    _M_t.
    super___uniq_ptr_impl<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::ActiveQueryContext_*,_std::default_delete<duckdb::ActiveQueryContext>_>
    .super__Head_base<0UL,_duckdb::ActiveQueryContext_*,_false>._M_head_impl = _Var8._M_head_impl;
    if (__ptr._M_head_impl != (ActiveQueryContext *)0x0) {
      ::std::default_delete<duckdb::ActiveQueryContext>::operator()
                ((default_delete<duckdb::ActiveQueryContext> *)&this->active_query,
                 __ptr._M_head_impl);
    }
    if ((ActiveQueryContext *)local_78._0_8_ != (ActiveQueryContext *)0x0) {
      ::std::default_delete<duckdb::ActiveQueryContext>::operator()
                ((default_delete<duckdb::ActiveQueryContext> *)local_78,
                 (ActiveQueryContext *)local_78._0_8_);
    }
    this_01 = &this->transaction;
    if ((this->transaction).auto_commit == true) {
      TransactionContext::BeginTransaction(this_01);
    }
    pDVar9 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(this_00);
    pDVar10 = DatabaseInstance::GetDatabaseManager(pDVar9);
    LOCK();
    paVar1 = &pDVar10->current_query_number;
    query_number = (ClientContextLock *)(paVar1->super___atomic_base<unsigned_long>)._M_i;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    TransactionContext::SetActiveQuery(this_01,(transaction_t)query_number);
    LogQueryInternal(this,query_number,query);
    pAVar11 = unique_ptr<duckdb::ActiveQueryContext,_std::default_delete<duckdb::ActiveQueryContext>,_true>
              ::operator->(&this->active_query);
    ::std::__cxx11::string::_M_assign((string *)pAVar11);
    QueryProgress::Initialize(&this->query_progress);
    this_02 = unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>,_true>
              ::operator->(&this->registered_state);
    RegisteredStateManager::States
              ((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_true> *)local_78,
               this_02);
    for (this_04 = (ActiveQueryContext *)local_78._0_8_;
        this_04 != (ActiveQueryContext *)local_78._8_8_;
        this_04 = (ActiveQueryContext *)&(this_04->query).field_2) {
      pCVar12 = shared_ptr<duckdb::ClientContextState,_true>::operator->
                          ((shared_ptr<duckdb::ClientContextState,_true> *)this_04);
      (**(code **)(*(long *)pCVar12 + 0x10))(pCVar12,this);
    }
    ::std::
    vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
    ::~vector((vector<duckdb::shared_ptr<duckdb::ClientContextState,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ClientContextState,_true>_>_>
               *)local_78);
    pLVar13 = unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>,_true>::operator->
                        (&this->logger);
    (*pLVar13->_vptr_Logger[4])(pLVar13);
    optional_idx::optional_idx((optional_idx *)local_78,this->connection_id);
    uVar3 = local_78._0_8_;
    pMVar14 = TransactionContext::ActiveTransaction(this_01);
    optional_idx::optional_idx((optional_idx *)local_78,pMVar14->global_transaction_id);
    uVar4 = local_78._0_8_;
    index = TransactionContext::GetActiveQuery(this_01);
    optional_idx::optional_idx((optional_idx *)local_78,index);
    uVar5 = local_78._0_8_;
    pDVar9 = shared_ptr<duckdb::DatabaseInstance,_true>::operator->(this_00);
    pLVar15 = shared_ptr<duckdb::LogManager,_true>::operator*(&pDVar9->log_manager);
    local_78[0x20] = '\x14';
    local_78._40_8_ = (__pthread_internal_list *)0xffffffffffffffff;
    local_78._48_8_ = uVar3;
    local_78._56_8_ = uVar4;
    local_38._M_p = (pointer)uVar5;
    context._1_7_ = local_78._33_7_;
    context.scope = 0x14;
    context.thread_id.index = 0xffffffffffffffff;
    context.connection_id.index = uVar3;
    context.transaction_id.index = uVar4;
    context.query_id.index = uVar5;
    LogManager::CreateLogger((LogManager *)local_78,context,SUB81(pLVar15,0),true);
    uVar3 = local_78._0_8_;
    local_78._0_8_ = (pointer)0x0;
    _Var2._M_head_impl =
         (this->logger).super_unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
         super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
         super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl;
    (this->logger).super_unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
    super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
    super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl = (Logger *)uVar3;
    if (_Var2._M_head_impl != (Logger *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_Logger + 8))();
    }
    if ((pointer)local_78._0_8_ != (pointer)0x0) {
      (**(code **)(*(long *)local_78._0_8_ + 8))();
    }
    this_03 = Logger::Get(this);
    iVar6 = (*this_03->_vptr_Logger[2])(this_03,"duckdb.ClientContext.BeginQuery",0x1e);
    if ((char)iVar6 != '\0') {
      Logger::WriteLog(this_03,"duckdb.ClientContext.BeginQuery",LOG_INFO,query);
    }
    return;
  }
  __return_storage_ptr__ = (FatalException *)__cxa_allocate_exception(0x10);
  ValidChecker::InvalidatedMessage_abi_cxx11_((string *)local_78,&pDVar7->db_validity);
  ErrorManager::InvalidatedDatabase(__return_storage_ptr__,this,(string *)local_78);
  __cxa_throw(__return_storage_ptr__,&FatalException::typeinfo,::std::runtime_error::~runtime_error)
  ;
}

Assistant:

void ClientContext::BeginQueryInternal(ClientContextLock &lock, const string &query) {
	// check if we are on AutoCommit. In this case we should start a transaction
	D_ASSERT(!active_query);
	auto &db_inst = DatabaseInstance::GetDatabase(*this);
	if (ValidChecker::IsInvalidated(db_inst)) {
		throw ErrorManager::InvalidatedDatabase(*this, ValidChecker::InvalidatedMessage(db_inst));
	}
	active_query = make_uniq<ActiveQueryContext>();
	if (transaction.IsAutoCommit()) {
		transaction.BeginTransaction();
	}

	transaction.SetActiveQuery(db->GetDatabaseManager().GetNewQueryNumber());
	LogQueryInternal(lock, query);
	active_query->query = query;

	query_progress.Initialize();
	// Notify any registered state of query begin
	for (auto &state : registered_state->States()) {
		state->QueryBegin(*this);
	}

	// Flush the old Logger
	logger->Flush();

	// Refresh the logger to ensure we are in sync with global log settings
	LoggingContext context(LogContextScope::CONNECTION);
	context.connection_id = connection_id;
	context.transaction_id = transaction.ActiveTransaction().global_transaction_id;
	context.query_id = transaction.GetActiveQuery();
	logger = db->GetLogManager().CreateLogger(context, true);
	DUCKDB_LOG_INFO(*this, "duckdb.ClientContext.BeginQuery", query);
}